

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

bool despot::Variable::IsVariablePrevName
               (string *name,vector<despot::StateVar,_std::allocator<despot::StateVar>_> *vars)

{
  pointer pSVar1;
  __type_conflict _Var2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ulong uVar4;
  long lVar5;
  
  uVar4 = 0xffffffffffffffff;
  lVar5 = 0x78;
  do {
    pSVar1 = (vars->super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>)._M_impl
             .super__Vector_impl_data._M_start;
    uVar3 = ((long)(vars->super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0xc0;
    uVar4 = uVar4 + 1;
    if (uVar3 <= uVar4) break;
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(pSVar1->super_NamedVar).super_Variable._vptr_Variable + lVar5);
    lVar5 = lVar5 + 0xc0;
    _Var2 = std::operator==(name,__rhs);
  } while (!_Var2);
  return uVar4 < uVar3;
}

Assistant:

bool Variable::IsVariablePrevName(string name, const vector<StateVar>& vars) {
	for (int i = 0; i < vars.size(); i++) {
		const StateVar& var = vars[i];
		if (name == var.prev_name())
			return true;
	}
	return false;
}